

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O0

deUint32 deqp::gles31::Functional::anon_unknown_0::paramsSeed(TestParams *params)

{
  deUint32 dVar1;
  deUint32 paramCode;
  TestParams *params_local;
  
  dVar1 = deUint32Hash((uint)(params->initSingle & 1) | (uint)(params->switchVtx & 1) << 1 |
                       (uint)(params->switchFrg & 1) << 2 | (uint)(params->useUniform & 1) << 3 |
                       (uint)(params->useSameName & 1) << 4 |
                       (uint)(params->useCreateHelper & 1) << 5 |
                       (uint)(params->useProgramUniform & 1) << 6);
  dVar1 = deUint32Hash(dVar1 + (params->varyings).count);
  dVar1 = deUint32Hash(dVar1 + (params->varyings).type);
  dVar1 = deUint32Hash(dVar1 + (params->varyings).binding);
  dVar1 = deUint32Hash(dVar1 + (params->varyings).vtxInterp);
  dVar1 = deUint32Hash(dVar1 + (params->varyings).frgInterp);
  return dVar1;
}

Assistant:

deUint32 paramsSeed (const TestParams& params)
{
	deUint32 paramCode	= (params.initSingle			<< 0 |
						   params.switchVtx				<< 1 |
						   params.switchFrg				<< 2 |
						   params.useUniform			<< 3 |
						   params.useSameName			<< 4 |
						   params.useCreateHelper		<< 5 |
						   params.useProgramUniform		<< 6);

	paramCode = deUint32Hash(paramCode) + params.varyings.count;
	paramCode = deUint32Hash(paramCode) + params.varyings.type;
	paramCode = deUint32Hash(paramCode) + params.varyings.binding;
	paramCode = deUint32Hash(paramCode) + params.varyings.vtxInterp;
	paramCode = deUint32Hash(paramCode) + params.varyings.frgInterp;

	return deUint32Hash(paramCode);
}